

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc_error.c
# Opt level: O0

Translation_Error *
get_translation_error(char *error_message,size_t line,size_t column,char *filename)

{
  undefined8 *puVar1;
  Translation_Error *ret;
  char *filename_local;
  size_t column_local;
  size_t line_local;
  char *error_message_local;
  
  puVar1 = (undefined8 *)malloc(0x20);
  *puVar1 = error_message;
  puVar1[2] = column;
  puVar1[1] = line;
  puVar1[3] = filename;
  return (Translation_Error *)error_message_local;
}

Assistant:

struct Translation_Error* get_translation_error(const char *error_message,size_t line,size_t column,const char *filename)
{
	struct Translation_Error *ret;
	ret=malloc(sizeof(struct Translation_Error));
	ret->error_message=error_message;
	ret->column=column;
	ret->line=line;
	ret->filename=filename;
}